

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O3

Float __thiscall pbrt::StratifiedSampler::Get1D(StratifiedSampler *this)

{
  undefined1 auVar1 [16];
  uint uVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  float fVar9;
  undefined1 in_ZMM0 [64];
  
  uVar5 = this->yPixelSamples * this->xPixelSamples;
  uVar6 = (long)this->seed ^ (long)this->dimension << 0x10 ^
          (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.y << 0x20 ^
          (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.x << 0x30;
  uVar6 = (uVar6 >> 0x1f ^ uVar6) * 0x7fb5d329728ea185;
  lVar7 = (uVar6 >> 0x1b ^ uVar6) * -0x7e25210b43d22bb3;
  uVar2 = this->sampleIndex;
  uVar4 = (uint)((ulong)lVar7 >> 0x21) ^ (uint)lVar7;
  uVar8 = uVar5 - 1 >> 1 | uVar5 - 1;
  uVar8 = uVar8 >> 2 | uVar8;
  uVar8 = uVar8 >> 4 | uVar8;
  uVar8 = uVar8 >> 8 | uVar8;
  uVar8 = uVar8 >> 0x10 | uVar8;
  do {
    uVar2 = (uVar2 ^ uVar4) * -0x1e8f76c3 ^ uVar4 >> 0x10;
    uVar2 = ((uVar2 & uVar8) >> 4 ^ uVar4 >> 8 ^ uVar2) * 0x929eb3f ^ uVar4 >> 0x17;
    uVar2 = ((uVar2 & uVar8) >> 1 ^ uVar2) * (uVar4 >> 0x1b | 1) * 0x6935fa69;
    uVar2 = ((uVar2 & uVar8) >> 0xb ^ uVar2) * 0x74dcb303;
    uVar2 = ((uVar2 & uVar8) >> 2 ^ uVar2) * -0x61afe33d;
    uVar2 = ((uVar2 & uVar8) >> 2 ^ uVar2) * -0x379f5c21 & uVar8;
    uVar2 = uVar2 >> 5 ^ uVar2;
  } while (uVar5 <= uVar2);
  this->dimension = this->dimension + 1;
  if (this->jitter == true) {
    uVar6 = (this->rng).state;
    (this->rng).state = uVar6 * 0x5851f42d4c957f2d + (this->rng).inc;
    uVar8 = (uint)(uVar6 >> 0x2d) ^ (uint)(uVar6 >> 0x1b);
    bVar3 = (byte)(uVar6 >> 0x3b);
    auVar1 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,uVar8 >> bVar3 | uVar8 << 0x20 - bVar3);
    auVar1 = vminss_avx(ZEXT416((uint)(auVar1._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
    fVar9 = auVar1._0_4_;
  }
  else {
    fVar9 = 0.5;
  }
  return (fVar9 + (float)(int)((uVar2 + uVar4) % uVar5)) / (float)(int)uVar5;
}

Assistant:

PBRT_CPU_GPU
    int SamplesPerPixel() const { return xPixelSamples * yPixelSamples; }